

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_setnativeclosurename(HSQUIRRELVM v,SQInteger idx,SQChar *name)

{
  SQUnsignedInteger *pSVar1;
  SQFloat SVar2;
  SQGenerator *pSVar3;
  SQGenerator *pSVar4;
  SQObjectPtr *pSVar5;
  SQGenerator *pSVar6;
  SQRESULT SVar7;
  SQNativeClosure *nc;
  
  if (idx < 0) {
    pSVar5 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar5 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  if ((pSVar5->super_SQObject)._type == OT_NATIVECLOSURE) {
    pSVar3 = (pSVar5->super_SQObject)._unVal.pGenerator;
    pSVar6 = (SQGenerator *)SQString::Create(v->_sharedstate,name,-1);
    pSVar4 = (pSVar3->_ci)._generator;
    SVar2 = (pSVar3->_ci)._closure.super_SQObject._unVal.fFloat;
    (pSVar3->_ci)._closure.super_SQObject._unVal.fFloat = 3.8518672e-34;
    (pSVar3->_ci)._generator = pSVar6;
    pSVar1 = &(pSVar6->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    if (((uint)SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQCollectable).super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    SVar7 = 0;
  }
  else {
    sq_throwerror(v,"the object is not a nativeclosure");
    SVar7 = -1;
  }
  return SVar7;
}

Assistant:

SQRESULT sq_setnativeclosurename(HSQUIRRELVM v,SQInteger idx,const SQChar *name)
{
    SQObject o = stack_get(v, idx);
    if(sq_isnativeclosure(o)) {
        SQNativeClosure *nc = _nativeclosure(o);
        nc->_name = SQString::Create(_ss(v),name);
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("the object is not a nativeclosure"));
}